

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

void __thiscall
miniros::RPCManager::removeASyncConnection(RPCManager *this,ASyncXMLRPCConnectionPtr *conn)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->removed_connections_mutex_);
  if (iVar1 == 0) {
    std::
    _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
    ::_M_insert_unique<std::shared_ptr<miniros::ASyncXMLRPCConnection>const&>
              ((_Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
                *)&this->removed_connections_,conn);
    pthread_mutex_unlock((pthread_mutex_t *)&this->removed_connections_mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void RPCManager::removeASyncConnection(const ASyncXMLRPCConnectionPtr& conn)
{
  std::scoped_lock<std::mutex> lock(removed_connections_mutex_);
  removed_connections_.insert(conn);
}